

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFMFileReader.cpp
# Opt level: O2

EStatusCode __thiscall PFMFileReader::ReadDWord(PFMFileReader *this,DWORD *outDWORD)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Byte buffer;
  
  *outDWORD = 0;
  if (this->mInternalReadStatus != eFailure) {
    iVar1 = (*(this->mReaderStream->super_IByteReader)._vptr_IByteReader[2])
                      (this->mReaderStream,&buffer,1);
    if (CONCAT44(extraout_var,iVar1) == 1) {
      *outDWORD = (ulong)buffer;
      iVar1 = (*(this->mReaderStream->super_IByteReader)._vptr_IByteReader[2])
                        (this->mReaderStream,&buffer,1);
      if (CONCAT44(extraout_var_00,iVar1) == 1) {
        *outDWORD = *outDWORD | (ulong)buffer << 8;
        iVar1 = (*(this->mReaderStream->super_IByteReader)._vptr_IByteReader[2])
                          (this->mReaderStream,&buffer,1);
        if (CONCAT44(extraout_var_01,iVar1) == 1) {
          *outDWORD = *outDWORD | (ulong)buffer << 0x10;
          iVar1 = (*(this->mReaderStream->super_IByteReader)._vptr_IByteReader[2])
                            (this->mReaderStream,&buffer,1);
          if (CONCAT44(extraout_var_02,iVar1) == 1) {
            *outDWORD = *outDWORD | (ulong)buffer << 0x18;
            return this->mInternalReadStatus;
          }
        }
      }
    }
    this->mInternalReadStatus = eFailure;
  }
  return eFailure;
}

Assistant:

EStatusCode PFMFileReader::ReadDWord(DWORD& outDWORD)
{
	IOBasicTypes::Byte buffer;
	outDWORD = 0;

	if(mInternalReadStatus != PDFHummus::eFailure)
	{
		if(mReaderStream->Read(&buffer,1) != 1)
		{
			mInternalReadStatus = PDFHummus::eFailure;
			return PDFHummus::eFailure;
		}

		outDWORD = buffer;

		if(mReaderStream->Read(&buffer,1) != 1)
		{
			mInternalReadStatus = PDFHummus::eFailure;
			return PDFHummus::eFailure;
		}

		outDWORD |= (((DWORD)buffer) << 8);

		if(mReaderStream->Read(&buffer,1) != 1)
		{
			mInternalReadStatus = PDFHummus::eFailure;
			return PDFHummus::eFailure;
		}

		outDWORD |= (((DWORD)buffer) << 16);

		if(mReaderStream->Read(&buffer,1) != 1)
		{
			mInternalReadStatus = PDFHummus::eFailure;
			return PDFHummus::eFailure;
		}

		outDWORD |= (((DWORD)buffer) << 24);
	}

	return mInternalReadStatus;
}